

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dchClass.c
# Opt level: O0

void Dch_ClassesStop(Dch_Cla_t *p)

{
  Dch_Cla_t *p_local;
  
  if (p->vClassNew != (Vec_Ptr_t *)0x0) {
    Vec_PtrFree(p->vClassNew);
  }
  if (p->vClassOld != (Vec_Ptr_t *)0x0) {
    Vec_PtrFree(p->vClassOld);
  }
  if (p->pId2Class != (Aig_Obj_t ***)0x0) {
    free(p->pId2Class);
    p->pId2Class = (Aig_Obj_t ***)0x0;
  }
  if (p->pClassSizes != (int *)0x0) {
    free(p->pClassSizes);
    p->pClassSizes = (int *)0x0;
  }
  if (p->pMemClasses != (Aig_Obj_t **)0x0) {
    free(p->pMemClasses);
    p->pMemClasses = (Aig_Obj_t **)0x0;
  }
  if (p != (Dch_Cla_t *)0x0) {
    free(p);
  }
  return;
}

Assistant:

void Dch_ClassesStop( Dch_Cla_t * p )
{
    if ( p->vClassNew )    Vec_PtrFree( p->vClassNew );
    if ( p->vClassOld )    Vec_PtrFree( p->vClassOld );
    ABC_FREE( p->pId2Class );
    ABC_FREE( p->pClassSizes );
    ABC_FREE( p->pMemClasses );
    ABC_FREE( p );
}